

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  if (argc != 1) {
    runFile(argv[1]);
  }
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
    if (argc == 1) {

    } else {
        runFile(argv[1]);
    }
    return 0;
}